

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O2

void V_CalcCleanFacs(int designwidth,int designheight,int realwidth,int realheight,int *cleanx,
                    int *cleany,int *_cx1,int *_cx2)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  float aspect;
  
  aspect = ActiveRatio(realwidth,realheight,(float *)0x0);
  iVar3 = AspectMultiplier(aspect);
  if (1.333 <= aspect) {
    iVar4 = (iVar3 * realwidth) / 0x30;
    iVar3 = realheight;
  }
  else {
    iVar4 = realwidth;
    iVar3 = (iVar3 * realheight) / 0x30;
  }
  iVar8 = 1;
  iVar7 = iVar4 / designwidth;
  if (iVar4 / designwidth < 2) {
    iVar7 = iVar8;
  }
  iVar4 = iVar3 / designheight;
  if (iVar3 / designheight < 2) {
    iVar4 = iVar8;
  }
  iVar3 = realwidth / designwidth;
  if (realwidth / designwidth < 2) {
    iVar3 = iVar8;
  }
  if (1 < realheight / designheight) {
    iVar8 = realheight / designheight;
  }
  uVar5 = iVar7 - iVar4;
  uVar1 = -uVar5;
  if (0 < (int)uVar5) {
    uVar1 = uVar5;
  }
  uVar6 = iVar3 - iVar8;
  uVar5 = -uVar6;
  if (0 < (int)uVar6) {
    uVar5 = uVar6;
  }
  iVar2 = iVar3;
  if (uVar1 <= uVar5) {
    iVar8 = iVar4;
    iVar2 = iVar7;
  }
  *cleanx = iVar2;
  *cleany = iVar8;
  if (*cleanx < iVar8) {
    *cleany = *cleanx;
  }
  else {
    *cleanx = iVar8;
  }
  if (_cx1 != (int *)0x0) {
    *_cx1 = iVar7;
  }
  if (_cx2 != (int *)0x0) {
    *_cx2 = iVar3;
  }
  return;
}

Assistant:

void V_CalcCleanFacs (int designwidth, int designheight, int realwidth, int realheight, int *cleanx, int *cleany, int *_cx1, int *_cx2)
{
	float ratio;
	int cwidth;
	int cheight;
	int cx1, cy1, cx2, cy2;

	ratio = ActiveRatio(realwidth, realheight);
	if (AspectTallerThanWide(ratio))
	{
		cwidth = realwidth;
		cheight = realheight * AspectMultiplier(ratio) / 48;
	}
	else
	{
		cwidth = realwidth * AspectMultiplier(ratio) / 48;
		cheight = realheight;
	}
	// Use whichever pair of cwidth/cheight or width/height that produces less difference
	// between CleanXfac and CleanYfac.
	cx1 = MAX(cwidth / designwidth, 1);
	cy1 = MAX(cheight / designheight, 1);
	cx2 = MAX(realwidth / designwidth, 1);
	cy2 = MAX(realheight / designheight, 1);
	if (abs(cx1 - cy1) <= abs(cx2 - cy2))
	{ // e.g. 640x360 looks better with this.
		*cleanx = cx1;
		*cleany = cy1;
	}
	else
	{ // e.g. 720x480 looks better with this.
		*cleanx = cx2;
		*cleany = cy2;
	}

	if (*cleanx < *cleany)
		*cleany = *cleanx;
	else
		*cleanx = *cleany;

	if (_cx1 != NULL)	*_cx1 = cx1;
	if (_cx2 != NULL)	*_cx2 = cx2;
}